

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

int INT_REVaction_set_output
              (CMConnection conn,EVstone stone,EVaction action,int output_index,EVstone target_stone
              )

{
  int condition;
  CMFormat format;
  EV_int_response response;
  int local_4c;
  EVstone local_48;
  EVaction local_44;
  int local_40;
  EVstone local_3c;
  undefined1 local_38 [4];
  int local_34;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVaction_set_output_req_formats);
  local_4c = condition;
  local_48 = stone;
  local_44 = action;
  local_40 = output_index;
  local_3c = target_stone;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVaction_set_output_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_4c);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern int
INT_REVaction_set_output(CMConnection conn, EVstone stone, EVaction action, int output_index, EVstone target_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVaction_set_output_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVaction_set_output_req_formats);
    request.stone = stone;
    request.action = action;
    request.output_index = output_index;
    request.target_stone = target_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVaction_set_output_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return response.ret;
}